

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void AdditionHelper<int,long,11>::
     AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (int *lhs,long *rhs,int *result)

{
  int iVar1;
  undefined4 *in_RDX;
  undefined8 *in_RSI;
  int64_t tmp;
  long *in_stack_ffffffffffffffc0;
  long *in_stack_ffffffffffffffc8;
  long lVar2;
  
  AdditionHelper<long,long,10>::
  AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            ((long *)*in_RSI,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  lVar2 = 0;
  iVar1 = std::numeric_limits<int>::max();
  if (lVar2 <= iVar1) {
    lVar2 = 0;
    iVar1 = std::numeric_limits<int>::min();
    if (iVar1 <= lVar2) {
      *in_RDX = 0;
      return;
    }
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void AdditionThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        //rhs is std::int64_t, lhs signed
        std::int64_t tmp = 0;

        AdditionHelper< std::int64_t, std::int64_t, AdditionState_CastInt64CheckOverflow >::AdditionThrow< E >( (std::int64_t)lhs, (std::int64_t)rhs, tmp );

        if( tmp <= std::numeric_limits<T>::max() &&
            tmp >= std::numeric_limits<T>::min() )
        {
            result = (T)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }